

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.h
# Opt level: O2

void __thiscall
KDIS::UTILS::Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::inPlanceTranspose
          (Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *this)

{
  float fVar1;
  KUINT16 i;
  long lVar2;
  float (*pafVar3) [3];
  KUINT16 j;
  long lVar4;
  float (*pafVar5) [3];
  
  pafVar5 = (float (*) [3])this;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    pafVar3 = pafVar5;
    for (lVar4 = 0; lVar2 != lVar4; lVar4 = lVar4 + 1) {
      fVar1 = (*(float (*) [3])*(float (*) [3])this)[lVar4];
      (*(float (*) [3])*(float (*) [3])this)[lVar4] = (*(float (*) [3])*pafVar3)[0];
      (*(float (*) [3])*pafVar3)[0] = fVar1;
      pafVar3 = pafVar3 + 1;
    }
    this = (Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *)((long)this + 0xc);
    pafVar5 = (float (*) [3])(*pafVar5 + 1);
  }
  return;
}

Assistant:

void inPlanceTranspose()
    {
        if( cols != rows )return;

        for( KUINT16 i = 0; i < rows; ++i )
        {
            for( KUINT16 j = 0; j < i; ++j )
            {
                Type aux = Data[i][j];
                Data[i][j] = Data[j][i];
                Data[j][i] = aux;
            }
        }
    }